

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::schema::Node::Builder::initInterface(Builder *__return_storage_ptr__,Builder *this)

{
  StructBuilder base;
  uint uVar1;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  PointerBuilder local_40;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = bounded<6u>();
  capnp::_::StructBuilder::setDataField<capnp::schema::Node::Which>(&this->_builder,uVar1,INTERFACE)
  ;
  uVar1 = bounded<3u>();
  capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  capnp::_::PointerBuilder::clear(&local_28);
  uVar1 = bounded<4u>();
  capnp::_::StructBuilder::getPointerField(&local_40,&this->_builder,uVar1);
  capnp::_::PointerBuilder::clear(&local_40);
  memcpy(&local_68,this,0x28);
  base.capTable = (CapTableBuilder *)uStack_60;
  base.segment = (SegmentBuilder *)local_68;
  base.data = (void *)local_58;
  base.pointers = (WirePointer *)uStack_50;
  base.dataSize = (undefined4)local_48;
  base.pointerCount = local_48._4_2_;
  base._38_2_ = local_48._6_2_;
  Interface::Builder::Builder(__return_storage_ptr__,base);
  return __return_storage_ptr__;
}

Assistant:

inline typename Node::Interface::Builder Node::Builder::initInterface() {
  _builder.setDataField<Node::Which>(
      ::capnp::bounded<6>() * ::capnp::ELEMENTS, Node::INTERFACE);
  _builder.getPointerField(::capnp::bounded<3>() * ::capnp::POINTERS).clear();
  _builder.getPointerField(::capnp::bounded<4>() * ::capnp::POINTERS).clear();
  return typename Node::Interface::Builder(_builder);
}